

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion * __thiscall AML::Quaternion::operator/=(Quaternion *this,double rhs)

{
  double rhs_local;
  Quaternion *this_local;
  
  (this->field_0).data[0] = (this->field_0).data[0] / rhs;
  (this->field_0).data[1] = (this->field_0).data[1] / rhs;
  (this->field_0).data[2] = (this->field_0).data[2] / rhs;
  (this->field_0).data[3] = (this->field_0).data[3] / rhs;
  return this;
}

Assistant:

Quaternion& Quaternion::operator/=(double rhs)
    {
        q0 /= rhs;
        q1 /= rhs;
        q2 /= rhs;
        q3 /= rhs;
        return *this;
    }